

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_from_sin
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined4 uVar1;
  undefined8 uVar2;
  batch *in_RAX;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM0 [64];
  batch<float,_xsimd::avx512bw> local_c0 [2];
  
  uVar1 = *(undefined4 *)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar3._16_4_ = uVar1;
  auVar3._20_4_ = uVar1;
  auVar3._24_4_ = uVar1;
  auVar3._28_4_ = uVar1;
  auVar3._32_4_ = uVar1;
  auVar3._36_4_ = uVar1;
  auVar3._40_4_ = uVar1;
  auVar3._44_4_ = uVar1;
  auVar3._48_4_ = uVar1;
  auVar3._52_4_ = uVar1;
  auVar3._56_4_ = uVar1;
  auVar3._60_4_ = uVar1;
  uVar2 = vcmpps_avx512f(in_ZMM0,auVar3,2);
  if ((short)uVar2 == -1) {
    vbroadcastss_avx512f(ZEXT416(0x3f800000));
  }
  else {
    auVar3 = vbroadcastss_avx512f
                       (ZEXT416(*(uint *)((long)&this[0x10].super_PolarExtentCore.
                                                 _vptr_PolarExtentCore + 4)));
    uVar2 = vcmpps_avx512f(auVar3,in_ZMM0,2);
    if ((short)uVar2 != -1) {
      vcmpps_avx512f(auVar3,in_ZMM0,6);
      auVar4 = vbroadcastss_avx512f
                         (ZEXT416(*(uint *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore))
      ;
      auVar3 = auVar4;
      in_RAX = xsimd::asin<float,xsimd::avx512bw>
                         (local_c0,(xsimd *)this,(batch<float,_xsimd::avx512bw> *)ctx);
      auVar3 = vmulps_avx512f(auVar3,auVar4);
      uVar1 = *(undefined4 *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar4._4_4_ = uVar1;
      auVar4._0_4_ = uVar1;
      auVar4._8_4_ = uVar1;
      auVar4._12_4_ = uVar1;
      auVar4._16_4_ = uVar1;
      auVar4._20_4_ = uVar1;
      auVar4._24_4_ = uVar1;
      auVar4._28_4_ = uVar1;
      auVar4._32_4_ = uVar1;
      auVar4._36_4_ = uVar1;
      auVar4._40_4_ = uVar1;
      auVar4._44_4_ = uVar1;
      auVar4._48_4_ = uVar1;
      auVar4._52_4_ = uVar1;
      auVar4._56_4_ = uVar1;
      auVar4._60_4_ = uVar1;
      vaddps_avx512f(auVar3,auVar4);
      vbroadcastss_avx512f(ZEXT416(0x3f800000));
    }
  }
  return in_RAX;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }